

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpSocketEngine_unix_p.cpp
# Opt level: O1

int __thiscall
BamTools::Internal::TcpSocketEngine::nativeSelect(TcpSocketEngine *this,int msecs,bool isRead)

{
  int iVar1;
  int iVar2;
  undefined7 in_register_00000011;
  fd_set *__arr;
  timeval *__timeout;
  fd_set fds;
  timeval tv;
  fd_set local_98;
  timeval local_10;
  
  __arr = &local_98;
  __arr = &local_98;
  local_98.fds_bits[0xe] = 0;
  local_98.fds_bits[0xf] = 0;
  local_98.fds_bits[0xc] = 0;
  local_98.fds_bits[0xd] = 0;
  local_98.fds_bits[10] = 0;
  local_98.fds_bits[0xb] = 0;
  local_98.fds_bits[8] = 0;
  local_98.fds_bits[9] = 0;
  local_98.fds_bits[6] = 0;
  local_98.fds_bits[7] = 0;
  local_98.fds_bits[4] = 0;
  local_98.fds_bits[5] = 0;
  local_98.fds_bits[2] = 0;
  local_98.fds_bits[3] = 0;
  local_98.fds_bits[0] = 0;
  local_98.fds_bits[1] = 0;
  iVar2 = this->m_socketDescriptor;
  iVar1 = iVar2 + 0x3f;
  if (-1 < iVar2) {
    iVar1 = iVar2;
  }
  local_98.fds_bits[iVar1 >> 6] = local_98.fds_bits[iVar1 >> 6] | 1L << ((byte)iVar2 & 0x3f);
  local_10.tv_sec = (__time_t)(msecs / 1000);
  local_10.tv_usec = (__suseconds_t)((msecs % 1000) * 1000);
  __timeout = (timeval *)0x0;
  if (-1 < msecs) {
    __timeout = &local_10;
  }
  if ((int)CONCAT71(in_register_00000011,isRead) == 0) {
    __arr = (fd_set *)0x0;
  }
  else {
    __arr = (fd_set *)0x0;
  }
  iVar2 = select(iVar2 + 1,(fd_set *)__arr,(fd_set *)__arr,(fd_set *)0x0,__timeout);
  return iVar2;
}

Assistant:

int TcpSocketEngine::nativeSelect(int msecs, bool isRead) const {

    // set up FD set
    fd_set fds;
    FD_ZERO(&fds);
    FD_SET(m_socketDescriptor, &fds);

    // setup our timeout
    timeval tv;
    tv.tv_sec  = msecs / 1000;
    tv.tv_usec = (msecs % 1000) * 1000;

    // do 'select'
    if ( isRead )
        return select(m_socketDescriptor + 1, &fds, 0, 0, (msecs < 0 ? 0 : &tv));
    else
        return select(m_socketDescriptor + 1, 0, &fds, 0, (msecs < 0 ? 0 : &tv));
}